

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall
LLVMBC::ModuleParseContext::parse_constants_block(ModuleParseContext *this,BlockOrRecord *entry)

{
  BlockOrRecord *pBVar1;
  bool bVar2;
  BlockOrRecord *entry_00;
  bool bVar3;
  
  this->constant_type = (Type *)0x0;
  entry_00 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (entry->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = entry_00 == pBVar1;
  if ((!bVar3) && (bVar2 = parse_constants_record(this,entry_00), bVar2)) {
    do {
      entry_00 = entry_00 + 1;
      bVar3 = entry_00 == pBVar1;
      if (bVar3) {
        return bVar3;
      }
      bVar2 = parse_constants_record(this,entry_00);
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

bool ModuleParseContext::parse_constants_block(const BlockOrRecord &entry)
{
	constant_type = nullptr;
	for (auto &child : entry.children)
		if (!parse_constants_record(child))
			return false;
	return true;
}